

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GPrim::get_displayOpacity
          (GPrim *this,float *dst,double t,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  string err;
  GeomPrimvar primvar;
  allocator local_389;
  string local_388;
  string local_368;
  GeomPrimvar local_348;
  
  GeomPrimvar::GeomPrimvar(&local_348);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_368,"displayOpacity",&local_389);
  bVar1 = get_primvar(this,&local_368,&local_348,&local_388);
  std::__cxx11::string::_M_dispose();
  if (bVar1) {
    bVar1 = GeomPrimvar::get_value<float>(&local_348,dst,(string *)0x0);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::_M_dispose();
  GeomPrimvar::~GeomPrimvar(&local_348);
  return bVar1;
}

Assistant:

bool GPrim::get_displayOpacity(float *dst, double t, const value::TimeSampleInterpolationType tinterp) const
{
  // TODO: timeSamples
  (void)t;
  (void)tinterp;

  GeomPrimvar primvar;
  std::string err;
  if (!get_primvar("displayOpacity", &primvar, &err)) {
    // TODO: report err
    return false;
  }

  return primvar.get_value(dst);
}